

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

char * mraa_get_pin_name(int pin)

{
  mraa_boolean_t mVar1;
  mraa_board_t *local_20;
  mraa_board_t *current_plat;
  mraa_pininfo_t *pmStack_10;
  int pin_local;
  
  if (plat == (mraa_board_t *)0x0) {
    pmStack_10 = (mraa_pininfo_t *)0x0;
  }
  else {
    local_20 = plat;
    mVar1 = mraa_is_sub_platform_id(pin);
    current_plat._4_4_ = pin;
    if (mVar1 != 0) {
      local_20 = plat->sub_platform;
      if (local_20 == (mraa_board_t *)0x0) {
        syslog(3,"mraa_get_pin_name: Sub platform Not Initialised");
        return (char *)0x0;
      }
      current_plat._4_4_ = mraa_get_sub_platform_index(pin);
    }
    if ((local_20->phy_pin_count + -1 < current_plat._4_4_) || (current_plat._4_4_ < 0)) {
      pmStack_10 = (mraa_pininfo_t *)0x0;
    }
    else {
      pmStack_10 = local_20->pins + current_plat._4_4_;
    }
  }
  return pmStack_10->name;
}

Assistant:

char*
mraa_get_pin_name(int pin)
{
    if (plat == NULL) {
        return 0;
    }

    mraa_board_t* current_plat = plat;
    if (mraa_is_sub_platform_id(pin)) {
        current_plat = plat->sub_platform;
        if (current_plat == NULL) {
            syslog(LOG_ERR, "mraa_get_pin_name: Sub platform Not Initialised");
            return 0;
        }
        pin = mraa_get_sub_platform_index(pin);
    }

    if (pin > (current_plat->phy_pin_count - 1) || pin < 0) {
        return NULL;
    }
    return (char*) current_plat->pins[pin].name;
}